

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTestsPropertiesCommand.cxx
# Opt level: O0

bool cmSetTestsPropertiesCommand::SetOneTest
               (string *tname,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *propertyPairs,cmMakefile *mf,string *errors)

{
  cmTest *this;
  size_type sVar1;
  ulong uVar2;
  reference prop;
  char *value;
  uint local_3c;
  uint k;
  cmTest *test;
  string *errors_local;
  cmMakefile *mf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *propertyPairs_local;
  string *tname_local;
  
  this = cmMakefile::GetTest(mf,tname);
  if (this == (cmTest *)0x0) {
    std::__cxx11::string::operator=((string *)errors,"Can not find test to add properties to: ");
    std::__cxx11::string::operator+=((string *)errors,(string *)tname);
    tname_local._7_1_ = false;
  }
  else {
    local_3c = 0;
    while( true ) {
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(propertyPairs);
      if (sVar1 <= local_3c) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](propertyPairs,(ulong)local_3c);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        prop = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](propertyPairs,(ulong)local_3c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](propertyPairs,(ulong)(local_3c + 1));
        value = (char *)std::__cxx11::string::c_str();
        cmTest::SetProperty(this,prop,value);
      }
      local_3c = local_3c + 2;
    }
    tname_local._7_1_ = true;
  }
  return tname_local._7_1_;
}

Assistant:

bool cmSetTestsPropertiesCommand::SetOneTest(
  const std::string& tname, std::vector<std::string>& propertyPairs,
  cmMakefile* mf, std::string& errors)
{
  if (cmTest* test = mf->GetTest(tname)) {
    // now loop through all the props and set them
    unsigned int k;
    for (k = 0; k < propertyPairs.size(); k = k + 2) {
      if (!propertyPairs[k].empty()) {
        test->SetProperty(propertyPairs[k], propertyPairs[k + 1].c_str());
      }
    }
  } else {
    errors = "Can not find test to add properties to: ";
    errors += tname;
    return false;
  }

  return true;
}